

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalTexture2DShadowGrad(ShaderEvalContext *c,TexLookupParams *param_2)

{
  float s;
  float t;
  float *pfVar1;
  float lod;
  float fVar2;
  TexLookupParams *param_1_local;
  ShaderEvalContext *c_local;
  
  pfVar1 = tcu::Vector<float,_4>::z(c->in);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::x(c->in);
  s = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::y(c->in);
  t = *pfVar1;
  lod = computeLodFromGrad2D(c);
  fVar2 = texture2DShadow(c,fVar2,s,t,lod);
  pfVar1 = tcu::Vector<float,_4>::x(&c->color);
  *pfVar1 = fVar2;
  return;
}

Assistant:

static void		evalTexture2DShadowGrad			(ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DShadow(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), computeLodFromGrad2D(c)); }